

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::BeginCustomSection
          (BinaryReaderObjdump *this,Offset size,string_view section_name)

{
  PrintDetails(this," - name: \"%.*s\"\n",section_name.size_ & 0xffffffff,section_name.data_);
  if (((this->super_BinaryReaderObjdumpBase).options_)->mode == Headers) {
    printf("\"%.*s\"\n",section_name.size_ & 0xffffffff,section_name.data_);
  }
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::BeginCustomSection(Offset size,
                                               string_view section_name) {
  PrintDetails(" - name: \"" PRIstringview "\"\n",
               WABT_PRINTF_STRING_VIEW_ARG(section_name));
  if (options_->mode == ObjdumpMode::Headers) {
    printf("\"" PRIstringview "\"\n",
           WABT_PRINTF_STRING_VIEW_ARG(section_name));
  }
  return Result::Ok;
}